

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsPipeline.cpp
# Opt level: O1

Ptr<GraphicsPipeline> __thiscall
myvk::GraphicsPipeline::Create
          (GraphicsPipeline *this,Ptr<PipelineLayout> *pipeline_layout,Ptr<RenderPass> *render_pass,
          vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
          *shader_stages,GraphicsPipelineState *pipeline_state,uint32_t subpass)

{
  element_type *peVar1;
  VkDevice pVVar2;
  PFN_vkCreateGraphicsPipelines p_Var3;
  element_type *peVar4;
  GraphicsPipeline *pGVar5;
  int iVar6;
  VkResult VVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  VkPipelineDepthStencilStateCreateInfo *pVVar9;
  Ptr<GraphicsPipeline> PVar10;
  shared_ptr<myvk::GraphicsPipeline> ret;
  VkGraphicsPipelineCreateInfo create_info;
  _func_int **local_d8;
  element_type *peStack_d0;
  GraphicsPipeline *local_c8;
  VkGraphicsPipelineCreateInfo local_c0;
  
  local_c8 = this;
  std::__shared_ptr<myvk::GraphicsPipeline,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<myvk::GraphicsPipeline>>
            ((__shared_ptr<myvk::GraphicsPipeline,(__gnu_cxx::_Lock_policy)2> *)&local_d8,
             (allocator<myvk::GraphicsPipeline> *)&local_c0);
  local_d8[3] = (_func_int *)
                (pipeline_layout->
                super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 4),
             &(pipeline_layout->super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount);
  local_d8[6] = (_func_int *)
                (render_pass->super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 7),
             &(render_pass->super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  pVVar9 = (VkPipelineDepthStencilStateCreateInfo *)0x0;
  memset(&local_c0,0,0x90);
  p_Var3 = vkCreateGraphicsPipelines;
  local_c0.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  local_c0.renderPass =
       ((render_pass->super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
       m_render_pass;
  peVar1 = (pipeline_layout->super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_c0.layout = peVar1->m_pipeline_layout;
  local_c0.pStages =
       (shader_stages->
       super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_c0.stageCount =
       (int)((ulong)((long)(shader_stages->
                           super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)local_c0.pStages) >>
            4) * -0x55555555;
  local_c0.pVertexInputState = &(pipeline_state->m_vertex_input_state).m_create_info;
  if ((pipeline_state->m_vertex_input_state).m_enable == false) {
    local_c0.pVertexInputState = (VkPipelineVertexInputStateCreateInfo *)pVVar9;
  }
  local_c0.pInputAssemblyState = &(pipeline_state->m_input_assembly_state).m_create_info;
  if ((pipeline_state->m_input_assembly_state).m_enable == false) {
    local_c0.pInputAssemblyState = (VkPipelineInputAssemblyStateCreateInfo *)pVVar9;
  }
  local_c0.pTessellationState = &(pipeline_state->m_tessellation_state).m_create_info;
  if ((pipeline_state->m_tessellation_state).m_enable == false) {
    local_c0.pTessellationState = (VkPipelineTessellationStateCreateInfo *)pVVar9;
  }
  local_c0.pViewportState = &(pipeline_state->m_viewport_state).m_create_info;
  if ((pipeline_state->m_viewport_state).m_enable == false) {
    local_c0.pViewportState = (VkPipelineViewportStateCreateInfo *)pVVar9;
  }
  local_c0.pMultisampleState = &(pipeline_state->m_multisample_state).m_create_info;
  if ((pipeline_state->m_multisample_state).m_enable == false) {
    local_c0.pMultisampleState = (VkPipelineMultisampleStateCreateInfo *)pVVar9;
  }
  local_c0.pDepthStencilState = &(pipeline_state->m_depth_stencil_state).m_create_info;
  if ((pipeline_state->m_depth_stencil_state).m_enable == false) {
    local_c0.pDepthStencilState = pVVar9;
  }
  local_c0.pColorBlendState = &(pipeline_state->m_color_blend_state).m_create_info;
  if ((pipeline_state->m_color_blend_state).m_enable == false) {
    local_c0.pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)pVVar9;
  }
  local_c0.pDynamicState = &(pipeline_state->m_dynamic_state).m_create_info;
  if ((pipeline_state->m_dynamic_state).m_enable == false) {
    local_c0.pDynamicState = (VkPipelineDynamicStateCreateInfo *)pVVar9;
  }
  local_c0.pRasterizationState = (VkPipelineRasterizationStateCreateInfo *)pipeline_state;
  local_c0.subpass = subpass;
  iVar6 = (*(peVar1->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  pVVar2 = *(VkDevice *)(*(long *)CONCAT44(extraout_var,iVar6) + 0x268);
  iVar6 = (*(((pipeline_layout->super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  VVar7 = (*p_Var3)(pVVar2,*(VkPipelineCache *)(*(long *)CONCAT44(extraout_var_00,iVar6) + 0x270),1,
                    &local_c0,(VkAllocationCallbacks *)0x0,(VkPipeline *)(local_d8 + 5));
  pGVar5 = local_c8;
  peVar4 = peStack_d0;
  if (VVar7 == VK_SUCCESS) {
    (local_c8->super_PipelineBase).super_DeviceObjectBase.super_Base.
    super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    peStack_d0 = (element_type *)0x0;
    (local_c8->super_PipelineBase).super_DeviceObjectBase.super_Base._vptr_Base = local_d8;
    (local_c8->super_PipelineBase).super_DeviceObjectBase.super_Base.
    super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
    local_d8 = (_func_int **)0x0;
  }
  else {
    (local_c8->super_PipelineBase).super_DeviceObjectBase.super_Base._vptr_Base = (_func_int **)0x0;
    (local_c8->super_PipelineBase).super_DeviceObjectBase.super_Base.
    super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  _Var8._M_pi = extraout_RDX;
  if (peStack_d0 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_d0);
    _Var8._M_pi = extraout_RDX_00;
  }
  PVar10.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  PVar10.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pGVar5;
  return (Ptr<GraphicsPipeline>)
         PVar10.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<GraphicsPipeline> GraphicsPipeline::Create(const Ptr<PipelineLayout> &pipeline_layout,
                                               const Ptr<RenderPass> &render_pass,
                                               const std::vector<VkPipelineShaderStageCreateInfo> &shader_stages,
                                               const GraphicsPipelineState &pipeline_state, uint32_t subpass) {
	auto ret = std::make_shared<GraphicsPipeline>();
	ret->m_pipeline_layout_ptr = pipeline_layout;
	ret->m_render_pass_ptr = render_pass;

	VkGraphicsPipelineCreateInfo create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
	create_info.renderPass = render_pass->GetHandle();
	create_info.layout = pipeline_layout->GetHandle();
	create_info.stageCount = shader_stages.size();
	create_info.pStages = shader_stages.data();
	pipeline_state.PopGraphicsPipelineCreateInfo(&create_info);
	create_info.subpass = subpass;

	if (vkCreateGraphicsPipelines(pipeline_layout->GetDevicePtr()->GetHandle(),
	                              pipeline_layout->GetDevicePtr()->GetPipelineCacheHandle(), 1, &create_info, nullptr,
	                              &ret->m_pipeline) != VK_SUCCESS)
		return nullptr;
	return ret;
}